

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_DynamicLib.cpp
# Opt level: O1

bool __thiscall axl::sys::psx::DynamicLib::getInfo(DynamicLib *this,int request,void *p)

{
  int iVar1;
  char *string;
  undefined4 in_register_00000034;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  iVar1 = dlinfo((this->super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>
                 ).m_h,CONCAT44(in_register_00000034,request));
  if (iVar1 == -1) {
    string = (char *)dlerror();
    err::Error::Error((Error *)&local_28,string);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  return iVar1 != -1;
}

Assistant:

bool
DynamicLib::getInfo(
	int request,
	void* p
) {
	int result = ::dlinfo(m_h, request, p);
	if (result == -1) {
		err::setError(::dlerror());
		return false;
	}

	return true;
}